

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader.cpp
# Opt level: O0

bool __thiscall Loader::checkIDCODE(Loader *this)

{
  bool bVar1;
  allocator local_99;
  string local_98 [39];
  allocator local_71;
  string local_70 [55];
  allocator local_39;
  string local_38 [32];
  Loader *local_18;
  Loader *this_local;
  
  local_18 = this;
  bVar1 = setIR(this,IDCODE);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,"00000000",&local_39);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,"0362D093",&local_71);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_98,"0FFFFFFF",&local_99);
    bVar1 = shiftDR(this,0x20,(string *)local_38,(string *)local_70,(string *)local_98);
    std::__cxx11::string::~string(local_98);
    std::allocator<char>::~allocator((allocator<char> *)&local_99);
    std::__cxx11::string::~string(local_70);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Loader::checkIDCODE() {
	if (!setIR(IDCODE))
		return false;

	if (!shiftDR(32, "00000000", "0362D093", "0FFFFFFF")) // FPGA IDCODE
		return false;

	return true;
}